

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O3

void strprepProfileLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  FILE *__stream;
  int iVar1;
  int32_t length;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  UStringPrepType type;
  int iVar5;
  UErrorCode code;
  char **__endptr;
  uint32_t rangeEnd;
  uint32_t rangeStart;
  char *end;
  uint32_t mapping [40];
  uint32_t local_f0;
  uint32_t local_ec;
  ulong local_e8;
  char *local_e0;
  uint32_t local_d8 [42];
  
  local_ec = 0;
  local_f0 = 0;
  pcVar2 = u_skipWhitespace((*fields)[0]);
  if (*pcVar2 == '@') {
    pcVar2 = pcVar2 + 1;
    iVar5 = *(int *)(*fields + 1) - (int)pcVar2;
    if (8 < iVar5) {
      iVar1 = strncmp(pcVar2,"normalize",9);
      if (iVar1 == 0) {
        options[8].doesOccur = '\x01';
        return;
      }
      if ((iVar5 != 9) && (iVar5 = strncmp(pcVar2,"check-bidi",10), iVar5 == 0)) {
        options[10].doesOccur = '\x01';
        return;
      }
    }
    strprepProfileLineFn_cold_1();
  }
  pcVar4 = fields[1][0];
  __endptr = (char **)fields[2][0];
  pcVar3 = strstr((char *)__endptr,"UNASSIGNED");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strstr((char *)__endptr,"PROHIBITED");
    if (pcVar3 != (char *)0x0) {
      u_parseCodePointRange(pcVar2,&local_ec,&local_f0,pErrorCode);
      if (U_ZERO_ERROR < *pErrorCode) {
        strprepProfileLineFn_cold_3();
        return;
      }
      type = USPREP_PROHIBITED;
      goto LAB_00109fa3;
    }
    pcVar3 = strstr((char *)__endptr,"MAP");
    if (pcVar3 == (char *)0x0) {
LAB_0010a09d:
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      code = U_INVALID_FORMAT_ERROR;
      goto LAB_0010a05c;
    }
    __endptr = &local_e0;
    local_e8 = strtoul(pcVar2,__endptr,0x10);
    if ((local_e0 <= pcVar2) || (local_e0 != (*fields)[1])) {
      strprepProfileLineFn_cold_4();
      goto LAB_0010a09d;
    }
    length = u_parseCodePoints(pcVar4,local_d8,0x28,pErrorCode);
    storeMapping((uint32_t)local_e8,local_d8,length,USPREP_MAP,pErrorCode);
  }
  else {
    u_parseCodePointRange(pcVar2,&local_ec,&local_f0,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      strprepProfileLineFn_cold_2();
      return;
    }
    type = USPREP_UNASSIGNED;
LAB_00109fa3:
    storeRange(local_ec,local_f0,type,pErrorCode);
  }
  code = *pErrorCode;
  if (code < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  __endptr = (char **)fields[2][0];
LAB_0010a05c:
  __stream = _stderr;
  pcVar2 = (*fields)[0];
  pcVar4 = u_errorName_63(code);
  fprintf(__stream,"gensprep error parsing  %s line %s at %s. Error: %s\n",context,pcVar2,__endptr,
          pcVar4);
  exit(*pErrorCode);
}

Assistant:

static void U_CALLCONV
strprepProfileLineFn(void *context,
              char *fields[][2], int32_t fieldCount,
              UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *map;
    uint32_t code;
    int32_t length;
   /*UBool* mapWithNorm = (UBool*) context;*/
    const char* typeName;
    uint32_t rangeStart=0,rangeEnd =0;
    const char* filename = (const char*) context;
    const char *s;

    s = u_skipWhitespace(fields[0][0]);
    if (*s == '@') {
        /* special directive */
        s++;
        length = (int32_t)(fields[0][1] - s);
        if (length >= NORMALIZE_DIRECTIVE_LEN
            && uprv_strncmp(s, NORMALIZE_DIRECTIVE, NORMALIZE_DIRECTIVE_LEN) == 0) {
            options[NORMALIZE].doesOccur = TRUE;
            return;
        }
        else if (length >= CHECK_BIDI_DIRECTIVE_LEN
            && uprv_strncmp(s, CHECK_BIDI_DIRECTIVE, CHECK_BIDI_DIRECTIVE_LEN) == 0) {
            options[CHECK_BIDI].doesOccur = TRUE;
            return;
        }
        else {
            fprintf(stderr, "gensprep error parsing a directive %s.", fields[0][0]);
        }
    }

    typeName = fields[2][0];
    map = fields[1][0];

    if(uprv_strstr(typeName, usprepTypeNames[USPREP_UNASSIGNED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_UNASSIGNED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_PROHIBITED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_PROHIBITED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_MAP])!=NULL){

        /* get the character code, field 0 */
        code=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || end!=fields[0][1]) {
            fprintf(stderr, "gensprep: syntax error in field 0 at %s\n", fields[0][0]);
            *pErrorCode=U_PARSE_ERROR;
            exit(U_PARSE_ERROR);
        }

        /* parse the mapping string */
        length=u_parseCodePoints(map, mapping, sizeof(mapping)/4, pErrorCode);
        
        /* store the mapping */
        storeMapping(code,mapping, length,USPREP_MAP, pErrorCode);

    }else{
        *pErrorCode = U_INVALID_FORMAT_ERROR;
    }
    
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing  %s line %s at %s. Error: %s\n",filename,
               fields[0][0],fields[2][0],u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

}